

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmnet.cpp
# Opt level: O2

void parse_tok(char **p,char **tok,size_t *tok_len)

{
  char cVar1;
  char *pcVar2;
  int iVar3;
  char *pcVar4;
  
  pcVar4 = *p;
  while( true ) {
    iVar3 = isspace((int)*pcVar4);
    if (iVar3 == 0) break;
    pcVar4 = pcVar4 + 1;
    *p = pcVar4;
  }
  *tok = pcVar4;
  pcVar4 = *p;
  pcVar2 = pcVar4;
  while( true ) {
    cVar1 = *pcVar2;
    if (cVar1 == '\0') break;
    iVar3 = isspace((int)cVar1);
    if (((iVar3 != 0) || (cVar1 == '\n')) || (cVar1 == '\r')) break;
    *p = pcVar2 + 1;
    pcVar4 = pcVar4 + 1;
    pcVar2 = pcVar2 + 1;
  }
  *tok_len = (long)pcVar4 - (long)*tok;
  return;
}

Assistant:

static void parse_tok(char *&p, char *&tok, size_t &tok_len)
{
    /* skip leading spaces */
    for ( ; isspace(*p) ; ++p) ;

    /* the token starts here */
    tok = p;

    /* 
     *   find the end of the token - it's the end of the string, or the next
     *   whitespace or newline (CR or LF) character 
     */
    for ( ; *p != '\0' && !isspace(*p) && *p != '\n' && *p != '\r' ; ++p) ;

    /* note the length of the token */
    tok_len = p - tok;
}